

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall customCountUnits_testAllInv_Test::TestBody(customCountUnits_testAllInv_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_R9;
  string local_448;
  AssertHelper local_428;
  Message local_420;
  unit_data local_418;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3e0;
  Message local_3d8;
  unit_data local_3d0;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_398;
  Message local_390;
  unit_data local_388;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_350;
  Message local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_278;
  Message local_270;
  unit_data local_268;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_230;
  Message local_228;
  unit_data local_220;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__6;
  precise_unit cunit3;
  AssertHelper local_1d8;
  Message local_1d0;
  unit_data local_1c8;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_190;
  Message local_188;
  unit_data local_180;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_148;
  Message local_140;
  unit_data local_138;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__3;
  precise_unit cunit2;
  AssertHelper local_f0;
  Message local_e8;
  unit_data local_e0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  Message local_a0;
  unit_data local_98;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_60;
  Message local_58 [3];
  unit_data local_40;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  precise_unit cunit1;
  uint16_t ii;
  customCountUnits_testAllInv_Test *this_local;
  
  for (cunit1.commodity_._2_2_ = 0; cunit1.commodity_._2_2_ < 0x10;
      cunit1.commodity_._2_2_ = cunit1.commodity_._2_2_ + 1) {
    join_0x00000000_0x00001200_ =
         units::precise::generate_custom_count_unit(cunit1.commodity_._2_2_);
    local_40 = units::precise_unit::base_units((precise_unit *)&gtest_ar_.message_);
    local_39 = units::precise::custom::is_custom_count_unit(&local_40);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_38,&local_39,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (!bVar1) {
      testing::Message::Message(local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_38,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x456,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(local_58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
    local_98 = units::precise_unit::base_units((precise_unit *)&gtest_ar_.message_);
    local_91 = units::precise::custom::is_custom_count_unit_inverted(&local_98);
    local_91 = !local_91;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit1.base_units())","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x459,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    local_e0 = units::precise_unit::base_units((precise_unit *)&gtest_ar_.message_);
    local_d9 = units::precise::custom::is_custom_unit(&local_e0);
    local_d9 = !local_d9;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d8,&local_d9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cunit2.base_units_,(internal *)local_d8,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x45b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&cunit2.base_units_);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    join_0x00000000_0x00001200_ = units::precise_unit::inv((precise_unit *)&gtest_ar_.message_);
    local_138 = units::precise_unit::base_units((precise_unit *)&gtest_ar__3.message_);
    local_131 = units::precise::custom::is_custom_count_unit(&local_138);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_130,&local_131,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_130,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x45d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    local_180 = units::precise_unit::base_units((precise_unit *)&gtest_ar__3.message_);
    local_179 = units::precise::custom::is_custom_count_unit_inverted(&local_180);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_178,&local_179,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__5.message_,(internal *)local_178,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit2.base_units())","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x460,pcVar2);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    local_1c8 = units::precise_unit::base_units((precise_unit *)&gtest_ar__3.message_);
    local_1c1 = units::precise::custom::is_custom_unit(&local_1c8);
    local_1c1 = !local_1c1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cunit3.base_units_,(internal *)local_1c0,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit2.base_units())","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x461,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      std::__cxx11::string::~string((string *)&cunit3.base_units_);
      testing::Message::~Message(&local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
    join_0x00000000_0x00001200_ = units::precise_unit::inv((precise_unit *)&gtest_ar__3.message_);
    local_220 = units::precise_unit::base_units((precise_unit *)&gtest_ar__6.message_);
    local_219 = units::precise::custom::is_custom_count_unit(&local_220);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_218,&local_219,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__7.message_,(internal *)local_218,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x463,pcVar2);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
    local_268 = units::precise_unit::base_units((precise_unit *)&gtest_ar__6.message_);
    local_261 = units::precise::custom::is_custom_count_unit_inverted(&local_268);
    local_261 = !local_261;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_260,&local_261,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__8.message_,(internal *)local_260,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit3.base_units())","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x466,pcVar2);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    local_2a9 = units::precise_unit::operator==
                          ((precise_unit *)&gtest_ar_.message_,(precise_unit *)&gtest_ar__3.message_
                          );
    local_2a9 = !local_2a9;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pMVar3 = testing::Message::operator<<
                         (&local_2b8,(char (*) [37])"Error with false comparison 1 index ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__9.message_,(internal *)local_2a8,
                 (AssertionResult *)"cunit1 == cunit2","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x468,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    local_2f1 = units::precise_unit::operator==
                          ((precise_unit *)&gtest_ar__3.message_,
                           (precise_unit *)&gtest_ar__6.message_);
    local_2f1 = !local_2f1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pMVar3 = testing::Message::operator<<
                         (&local_300,(char (*) [37])"Error with false comparison 2 index ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__10.message_,(internal *)local_2f0,
                 (AssertionResult *)"cunit2 == cunit3","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_308,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
      testing::Message::~Message(&local_300);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    local_339 = units::precise_unit::operator==
                          ((precise_unit *)&gtest_ar_.message_,(precise_unit *)&gtest_ar__6.message_
                          );
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_338,&local_339,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      pMVar3 = testing::Message::operator<<(&local_348,(char (*) [22])"Error with inversion ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__11.message_,(internal *)local_338,
                 (AssertionResult *)"cunit1 == cunit3","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_350,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
    local_388 = units::precise_unit::base_units((precise_unit *)&gtest_ar_.message_);
    local_381 = units::precise::custom::is_custom_count_unit(&local_388);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_380,&local_381,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pMVar3 = testing::Message::operator<<
                         (&local_390,(char (*) [34])"Error with custom unit detection ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__12.message_,(internal *)local_380,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_398,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    local_3d0 = units::precise_unit::base_units((precise_unit *)&gtest_ar__3.message_);
    local_3c9 = units::precise::custom::is_custom_count_unit(&local_3d0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pMVar3 = testing::Message::operator<<
                         (&local_3d8,(char (*) [45])"Error with custom unit detection of inverse ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__13.message_,(internal *)local_3c8,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3e0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
    local_418 = units::precise_unit::base_units((precise_unit *)&gtest_ar__6.message_);
    local_411 = units::precise::custom::is_custom_count_unit(&local_418);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_410,&local_411,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      pMVar3 = testing::Message::operator<<
                         (&local_420,(char (*) [41])"Error with custom unit detection inv inv");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_448,(internal *)local_410,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x471,pcVar2);
      testing::internal::AssertHelper::operator=(&local_428,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      testing::Message::~Message(&local_420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  }
  return;
}

Assistant:

TEST(customCountUnits, testAllInv)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit1.base_units()));

        EXPECT_FALSE(precise::custom::is_custom_unit(cunit1.base_units()));
        auto cunit2 = cunit1.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()));
        EXPECT_TRUE(
            precise::custom::is_custom_count_unit_inverted(
                cunit2.base_units()));
        EXPECT_FALSE(precise::custom::is_custom_unit(cunit2.base_units()));
        auto cunit3 = cunit2.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit3.base_units()));

        EXPECT_FALSE(cunit1 == cunit2)
            << "Error with false comparison 1 index " << ii;
        EXPECT_FALSE(cunit2 == cunit3)
            << "Error with false comparison 2 index " << ii;
        EXPECT_TRUE(cunit1 == cunit3) << "Error with inversion " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()))
            << "Error with custom unit detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()))
            << "Error with custom unit detection of inverse " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()))
            << "Error with custom unit detection inv inv" << ii;
    }
}